

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

void __thiscall RenX::Server::sendAdmChan(Server *this,char *fmt,...)

{
  char in_AL;
  long lVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t i;
  long lVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string_view sVar4;
  string message;
  va_list args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_f8.reg_save_area = local_d8;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_f8.overflow_arg_area = &message._M_string_length;
  local_f8.gp_offset = 0x10;
  local_f8.fp_offset = 0x30;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  sVar4 = getPrefix(this);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,sVar4._M_str,sVar4._M_str + sVar4._M_len);
  if (local_138._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_138,' ');
  }
  vstring_printf_abi_cxx11_(&local_118,fmt,&local_f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&local_138,local_118._M_dataplus._M_p,local_118._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  lVar3 = 0;
  while( true ) {
    lVar1 = ServerManager::size();
    if (lVar3 == lVar1) break;
    uVar2 = ServerManager::getServer(_serverManager);
    Jupiter::IRC::Client::messageChannels
              (uVar2,this->m_adminLogChanType,local_138._M_string_length,local_138._M_dataplus._M_p)
    ;
    lVar3 = lVar3 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RenX::Server::sendAdmChan(const char *fmt, ...) const {
	va_list args;
	va_start(args, fmt);

	std::string message{ getPrefix() };
	if (!message.empty()) {
		message += ' ';
	}
	message += vstring_printf(fmt, args);

	for (size_t i = 0; i != serverManager->size(); i++) {
		serverManager->getServer(i)->messageChannels(m_adminLogChanType, message);
	}
}